

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmCmpiEa<(moira::Instr)36,(moira::Mode)8,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  Syntax SVar2;
  char *pcVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  Ea<(moira::Mode)8,_1> dst;
  u32 local_3c;
  ushort local_38;
  uint local_34;
  
  *addr = *addr + 2;
  iVar5 = (*this->_vptr_Moira[6])();
  local_38 = op & 7;
  local_3c = *addr;
  *addr = local_3c + 2;
  local_34 = (*this->_vptr_Moira[6])(this);
  local_34 = local_34 & 0xffff;
  uVar8 = local_34 << 0x10;
  *addr = *addr + 2;
  uVar6 = (*this->_vptr_Moira[6])(this);
  local_34 = uVar6 & 0xffff | uVar8;
  cVar4 = 'c';
  lVar7 = 0;
  do {
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = cVar4;
    cVar4 = "cmpi"[lVar7 + 1];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  if (str->style->syntax - MOIRA_MIT < 3) {
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = 'b';
  }
  else {
    cVar4 = '.';
    lVar7 = 0;
    do {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = cVar4;
      cVar4 = ".b"[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 2);
  }
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = ' ';
  }
  else {
    iVar1 = (str->tab).raw;
    do {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = ' ';
    } while (str->ptr < str->base + iVar1);
  }
  pcVar3 = str->ptr;
  str->ptr = pcVar3 + 1;
  *pcVar3 = '#';
  StrWriter::operator<<(str,(Int)(int)(char)iVar5);
  pcVar3 = str->ptr;
  str->ptr = pcVar3 + 1;
  *pcVar3 = ',';
  SVar2 = str->style->syntax;
  if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = ' ';
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)8,_1> *)&local_3c);
  return;
}

Assistant:

void
Moira::dasmCmpiEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = dasmIncRead<S>(addr);
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << str.tab << Ims<S>(src) << Sep{} << dst;
    str << Av<I, M, S>{};
}